

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void test_to<char>(char *s,uint codepoint)

{
  bool bVar1;
  code_point cVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  long lStack_60;
  allocator local_49;
  char *begin;
  string local_40;
  
  lVar9 = 1;
  lVar4 = 0;
  do {
    lVar9 = lVar9 + -1;
    pcVar8 = s + lVar4;
    lVar4 = lVar4 + 1;
  } while (*pcVar8 != '\0');
  test_counter = test_counter + 2;
  pcVar8 = s + -lVar9;
  begin = s;
  cVar2 = booster::locale::utf::utf_traits<char,1>::decode<char_const*>(&begin,pcVar8);
  if (cVar2 != codepoint) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x51);
    poVar5 = std::operator<<(poVar5," tr::template decode<CharType const *>(begin,end) == codepoint"
                            );
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar3 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar1) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
      booster::runtime_error::runtime_error(prVar6,&local_40);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (codepoint != 0xffffffff) {
    test_counter = test_counter + 1;
    if (pcVar8 != begin) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x54);
      poVar5 = std::operator<<(poVar5," end == begin");
      std::endl<char,std::char_traits<char>>(poVar5);
      iVar3 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar3;
      if (bVar1) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
        booster::runtime_error::runtime_error(prVar6,&local_40);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    if (codepoint == 0xfffffffe) {
      test_counter = test_counter + 1;
      if ((*s != '\0') &&
         (iVar3 = booster::locale::utf::utf_traits<char,_1>::trail_length(*s), iVar3 < 1)) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x57);
        poVar5 = std::operator<<(poVar5," *s== 0 || 0 < tr::trail_length(*s)");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
          booster::runtime_error::runtime_error(prVar6,&local_40);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      iVar3 = booster::locale::utf::utf_traits<char,_1>::trail_length(*s);
      if ((long)(iVar3 + 1) <= -lVar9) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x58);
        poVar5 = std::operator<<(poVar5," tr::trail_length(*s) + 1 > end - s");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
          booster::runtime_error::runtime_error(prVar6,&local_40);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    else {
      test_counter = test_counter + 2;
      begin = s;
      while( true ) {
        begin = begin + 1;
        test_counter = test_counter + 1;
        if (pcVar8 == begin) break;
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x61);
        poVar5 = std::operator<<(poVar5," tr::is_trail(*begin)");
        std::endl<char,std::char_traits<char>>(poVar5);
        if (0x14 < error_counter) {
          error_counter = error_counter + 1;
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
          booster::runtime_error::runtime_error(prVar6,&local_40);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
        test_counter = test_counter + 1;
        error_counter = error_counter + 1;
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x62);
        poVar5 = std::operator<<(poVar5," !tr::is_lead(*begin)");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
          booster::runtime_error::runtime_error(prVar6,&local_40);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      if (codepoint < 0x80) {
        lStack_60 = 1;
      }
      else if (codepoint < 0x800) {
        lStack_60 = 2;
      }
      else {
        lStack_60 = 4 - (ulong)(codepoint < 0x10000);
      }
      if (lStack_60 + lVar9 != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x65);
        poVar5 = std::operator<<(poVar5," tr::width(codepoint)==end - s");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
          booster::runtime_error::runtime_error(prVar6,&local_40);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      iVar3 = booster::locale::utf::utf_traits<char,_1>::trail_length(*s);
      iVar7 = 0;
      if (0x7f < codepoint) {
        if (codepoint < 0x800) {
          iVar7 = 1;
        }
        else {
          iVar7 = 3 - (uint)(codepoint < 0x10000);
        }
      }
      if (iVar3 != iVar7) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x66);
        poVar5 = std::operator<<(poVar5," tr::trail_length(*s) == tr::width(codepoint) - 1");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
          booster::runtime_error::runtime_error(prVar6,&local_40);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      begin = s;
      cVar2 = booster::locale::utf::utf_traits<char,1>::decode_valid<char_const*>(&begin);
      if (cVar2 != codepoint) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x68);
        poVar5 = std::operator<<(poVar5," tr::decode_valid(begin) == codepoint");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
          booster::runtime_error::runtime_error(prVar6,&local_40);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if (pcVar8 != begin) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x69);
        poVar5 = std::operator<<(poVar5," begin == end");
        std::endl<char,std::char_traits<char>>(poVar5);
        iVar3 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar3;
        if (bVar1) {
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_40,"Error limits reached, stopping unit test",&local_49);
          booster::runtime_error::runtime_error(prVar6,&local_40);
          __cxa_throw(prVar6,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
  }
  return;
}

Assistant:

void test_to(CharType const *s,unsigned codepoint)
{
    CharType const *begin = s;
    CharType const *end = begin;

    while(*end)
        end++;

    typedef utf_traits<CharType> tr;
    
    TEST(tr::max_width == 4 / sizeof(CharType));

    TEST(tr::template decode<CharType const *>(begin,end) == codepoint);

    if(codepoint == incomplete || codepoint != illegal)
        TEST(end == begin);

    if(codepoint == incomplete) {
        TEST(*s== 0 || 0 < tr::trail_length(*s));
        TEST(tr::trail_length(*s) + 1 > end - s);
    }

    if(codepoint != incomplete && codepoint != illegal) {
        begin=s;
        TEST(tr::is_lead(*begin));
        TEST(!tr::is_trail(*begin));
        begin++;
        while(begin!=end) {
            TEST(tr::is_trail(*begin));
            TEST(!tr::is_lead(*begin));
            begin++;
        }
        TEST(tr::width(codepoint)==end - s);
        TEST(tr::trail_length(*s) == tr::width(codepoint) - 1);
        begin = s;
        TEST(tr::decode_valid(begin) == codepoint);
        TEST(begin == end);
    }
}